

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O2

void test_ADynArray_insert_success_beyondEndIndex_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *expr;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char c;
  code *local_48;
  code *pcStack_40;
  code *local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  
  local_48 = private_ACUtilsTest_ADynArray_realloc;
  pcStack_40 = private_ACUtilsTest_ADynArray_free;
  local_30 = (char *)0x5;
  local_38 = private_ACUtilsTest_ADynArray_growStrategy;
  local_28 = (char *)0x8;
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  local_20 = (char *)private_ACUtilsTest_ADynArray_realloc((void *)0x0,8);
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  builtin_strncpy(local_20,"01234",5);
  c = '\0';
  bVar1 = private_ACUtils_ADynArray_insertArray(&local_48,0x29a,&c,1,1);
  if (bVar1 == true) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x29a);
    if (local_30 == (char *)0x6) {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x29b);
      if (local_28 == (char *)0x8) {
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x29c);
        if (local_20 == (char *)0x0) {
          pcVar3 = (char *)0x0;
          pcVar7 = (char *)0x0;
          expr = "Assertion \'_ck_x != NULL\' failed";
          pcVar4 = "Assertion \'%s\' failed: %s == %#x";
          pcVar5 = "(void*) array.buffer != NULL";
          pcVar6 = "(void*) array.buffer";
          iVar2 = 0x29d;
        }
        else {
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x29d);
          pcVar3 = (char *)(long)local_20[5];
          if (pcVar3 == (char *)0x0) {
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x29e);
            pcVar7 = local_20;
            if (local_20 == (char *)0x0) {
              pcVar3 = "";
              pcVar7 = "(null)";
            }
            else {
              iVar2 = strcmp("01234",local_20);
              if (iVar2 == 0) {
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                            ,0x29f);
                if (local_38 == (code *)0x0) {
                  pcVar3 = (char *)0x0;
                  pcVar7 = (char *)0x0;
                  expr = "Assertion \'_ck_x != NULL\' failed";
                  pcVar4 = "Assertion \'%s\' failed: %s == %#x";
                  pcVar5 = "(void*) array.growStrategy != NULL";
                  pcVar6 = "(void*) array.growStrategy";
                  iVar2 = 0x2a0;
                }
                else {
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                              ,0x2a0);
                  if (private_ACUtilsTest_ADynArray_reallocCount == 0) {
                    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                                ,0x2a1);
                    (*pcStack_40)(local_20);
                    return;
                  }
                  pcVar7 = "0";
                  expr = "Assertion \'_ck_x == _ck_y\' failed";
                  pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                  pcVar5 = "private_ACUtilsTest_ADynArray_reallocCount == 0";
                  pcVar6 = "private_ACUtilsTest_ADynArray_reallocCount";
                  iVar2 = 0x2a1;
                  pcVar3 = (char *)private_ACUtilsTest_ADynArray_reallocCount;
                }
                goto LAB_0010f23a;
              }
              pcVar3 = "\"";
            }
            expr = 
            "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
            ;
            pcVar4 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
            pcVar5 = "array.buffer == \"01234\"";
            pcVar6 = "array.buffer";
            iVar2 = 0x29f;
          }
          else {
            pcVar7 = "\'\\0\'";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar4 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
            pcVar5 = "array.buffer[5] == \'\\0\'";
            pcVar6 = "array.buffer[5]";
            iVar2 = 0x29e;
          }
        }
      }
      else {
        pcVar7 = "8";
        expr = "Assertion \'_ck_x == _ck_y\' failed";
        pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
        pcVar5 = "array.capacity == 8";
        pcVar6 = "array.capacity";
        iVar2 = 0x29c;
        pcVar3 = local_28;
      }
    }
    else {
      pcVar7 = "6";
      expr = "Assertion \'_ck_x == _ck_y\' failed";
      pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
      pcVar5 = "array.size == 6";
      pcVar6 = "array.size";
      iVar2 = 0x29b;
      pcVar3 = local_30;
    }
  }
  else {
    pcVar3 = (char *)(ulong)bVar1;
    pcVar7 = "true";
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar5 = 
    "private_ACUtils_ADynArray_insertArray(&array, 666, &(c), 1, sizeof(*(&array)->buffer)) == true"
    ;
    pcVar6 = 
    "private_ACUtils_ADynArray_insertArray(&array, 666, &(c), 1, sizeof(*(&array)->buffer))";
    iVar2 = 0x29a;
  }
LAB_0010f23a:
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,iVar2,expr,pcVar4,pcVar5,pcVar6,pcVar3,pcVar7);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_insert_success_beyondEndIndex)
{
    struct private_ACUtilsTest_ADynArray_CharArray array = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    array.size = 5;
    array.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    array.capacity = 8;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    array.buffer = (char*) array.reallocator(nullptr, array.capacity);
    memcpy(array.buffer, "01234", 5);
    private_ACUtilsTest_ADynArray_reallocCount = 0;
    char c = '\0';
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_insert(&array, 666, c), true);
    ACUTILSTEST_ASSERT_UINT_EQ(array.size, 6);
    ACUTILSTEST_ASSERT_UINT_EQ(array.capacity, 8);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.buffer);
    ACUTILSTEST_ASSERT_INT_EQ(array.buffer[5], '\0');
    ACUTILSTEST_ASSERT_STR_EQ(array.buffer, "01234");
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.growStrategy);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 0);
    array.deallocator(array.buffer);
}